

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentVarLocation.cpp
# Opt level: O0

void __thiscall
license::locate::EnvironmentVarLocation::~EnvironmentVarLocation(EnvironmentVarLocation *this)

{
  EnvironmentVarLocation *this_local;
  
  ~EnvironmentVarLocation(this);
  operator_delete(this);
  return;
}

Assistant:

EnvironmentVarLocation::~EnvironmentVarLocation() {}